

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_test.cpp
# Opt level: O0

void test_json_class_exceptions(void)

{
  bool bVar1;
  string *psVar2;
  json_exception *e_22;
  json j2_3;
  json j1_3;
  json_exception *e_21;
  json j2_2;
  json j1_2;
  json_exception *e_20;
  json j2_1;
  json j1_1;
  json_exception *e_19;
  json j2;
  json j1;
  json_exception *e_18;
  string local_ad8 [32];
  undefined1 local_ab8 [8];
  json r1_3;
  json_exception *e_17;
  string local_a50 [32];
  undefined1 local_a30 [8];
  json r2_1;
  string local_9d0 [32];
  undefined1 local_9b0 [8];
  json r1_2;
  json_exception *e_16;
  string local_948 [32];
  undefined1 local_928 [8];
  json r1_1;
  json_exception *e_15;
  string local_8c0 [32];
  undefined1 local_8a0 [8];
  json r2;
  string local_840 [32];
  undefined1 local_820 [8];
  json r1;
  json_exception *e_14;
  allocator local_761;
  string local_760 [32];
  undefined1 local_740 [8];
  json j_15;
  json_exception *e_13;
  undefined1 local_688 [8];
  json j_14;
  json j;
  json_array_index_range_exception *e_12;
  json j_13;
  json_array_index_range_exception *e_11;
  json j_12;
  json_exception *e_10;
  json j_11;
  json_exception *e_9;
  json j_10;
  json_exception *e_8;
  json j_9;
  json_exception *e_7;
  undefined1 local_3d0 [8];
  json j_8;
  json_exception *e_6;
  allocator local_349;
  string local_348 [32];
  undefined1 local_328 [8];
  json j_7;
  json_exception *e_5;
  json j_6;
  json_exception *e_4;
  string local_260 [32];
  undefined1 local_240 [8];
  json j_5;
  json_exception *e_3;
  json j_4;
  json_exception *e_2;
  string local_178 [32];
  undefined1 local_158 [8];
  json j_3;
  json_exception *e_1;
  string local_f0 [32];
  undefined1 local_d0 [8];
  json j_2;
  json_exception *e;
  undefined1 local_60 [8];
  json j_1;
  
  argo::json::json((json *)local_60,100);
  std::operator<<((ostream *)jlog,"FAIL: construct invalid type failed to throw exception\n");
  argo::json::~json((json *)local_60);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_f0,"asdadasd",(allocator *)((long)&e_1 + 7));
  argo::json::json((json *)local_d0,array_e,(string *)local_f0);
  std::__cxx11::string::~string(local_f0);
  std::allocator<char>::~allocator((allocator<char> *)((long)&e_1 + 7));
  std::operator<<((ostream *)jlog,
                  "FAIL: construct invalid type with raw value failed to throw exception\n");
  argo::json::~json((json *)local_d0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_178,"100",(allocator *)((long)&e_2 + 7));
  argo::json::json((json *)local_158,number_int_e,(string *)local_178);
  std::__cxx11::string::~string(local_178);
  std::allocator<char>::~allocator((allocator<char> *)((long)&e_2 + 7));
  argo::json::operator_cast_to_int((json *)local_158);
  std::operator<<((ostream *)jlog,"FAIL: cast raw to int failed to throw exception\n");
  argo::json::~json((json *)local_158);
  argo::json::json((json *)&e_3,"100");
  argo::json::operator_cast_to_int((json *)&e_3);
  std::operator<<((ostream *)jlog,"FAIL: cast string to int failed to throw exception\n");
  argo::json::~json((json *)&e_3);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_260,"100",(allocator *)((long)&e_4 + 7));
  argo::json::json((json *)local_240,number_double_e,(string *)local_260);
  std::__cxx11::string::~string(local_260);
  std::allocator<char>::~allocator((allocator<char> *)((long)&e_4 + 7));
  argo::json::operator_cast_to_double((json *)local_240);
  std::operator<<((ostream *)jlog,"FAIL: cast raw double to double failed to throw exception\n");
  argo::json::~json((json *)local_240);
  argo::json::json((json *)&e_5,"100");
  argo::json::operator_cast_to_double((json *)&e_5);
  std::operator<<((ostream *)jlog,"FAIL: cast string to double failed to throw exception\n");
  argo::json::~json((json *)&e_5);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_348,"100",&local_349);
  argo::json::json((json *)local_328,string_e,(string *)local_348);
  std::__cxx11::string::~string(local_348);
  std::allocator<char>::~allocator((allocator<char> *)&local_349);
  psVar2 = argo::json::operator_cast_to_string_((json *)local_328);
  std::__cxx11::string::string((string *)&e_6,(string *)psVar2);
  std::__cxx11::string::~string((string *)&e_6);
  std::operator<<((ostream *)jlog,"FAIL: cast raw string to string failed to throw exception\n");
  argo::json::~json((json *)local_328);
  argo::json::json((json *)local_3d0,100);
  psVar2 = argo::json::operator_cast_to_string_((json *)local_3d0);
  std::__cxx11::string::string((string *)&e_7,(string *)psVar2);
  std::__cxx11::string::~string((string *)&e_7);
  std::operator<<((ostream *)jlog,"FAIL: cast int to string failed to throw exception\n");
  argo::json::~json((json *)local_3d0);
  argo::json::json((json *)&e_8,"asdasd");
  argo::json::operator_cast_to_bool((json *)&e_8);
  std::operator<<((ostream *)jlog,"FAIL: cast string to bool failed to throw exception\n");
  argo::json::~json((json *)&e_8);
  argo::json::json((json *)&e_9,"asdasd");
  argo::json::operator[]((json *)&e_9,"asdasd");
  std::operator<<((ostream *)jlog,
                  "FAIL: attempt to access string via [\"name\"] failed to throw exception\n");
  argo::json::~json((json *)&e_9);
  argo::json::json((json *)&e_10,"asdasd");
  argo::json::operator[]((json *)&e_10,1);
  std::operator<<((ostream *)jlog,
                  "FAIL: attempt to access string via [1] failed to throw exception\n");
  argo::json::~json((json *)&e_10);
  argo::json::json((json *)&e_11,array_e);
  argo::json::operator[]((json *)&e_11,1);
  std::operator<<((ostream *)jlog,
                  "FAIL: attempt to access item 1 of zero length array failed to throw exception\n")
  ;
  argo::json::~json((json *)&e_11);
  argo::json::json((json *)&e_12,array_e);
  argo::json::operator[]((json *)&e_12,-1);
  std::operator<<((ostream *)jlog,
                  "FAIL: attempt to access item -1 of zero length array failed to throw exception\n"
                 );
  argo::json::~json((json *)&e_12);
  argo::json::json((json *)&j_14.field_0x50,object_e);
  test_const_exception((json *)&j_14.field_0x50);
  argo::json::json((json *)local_688,1);
  argo::json::json((json *)&e_13,1);
  argo::json::append((json *)local_688,(json *)&e_13);
  argo::json::~json((json *)&e_13);
  std::operator<<((ostream *)jlog,"FAIL: attempt to append to non-array failed to throw exception\n"
                 );
  argo::json::~json((json *)local_688);
  argo::json::json((json *)local_740,1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_760,"asdasd",&local_761);
  argo::json::json((json *)&e_14,1);
  argo::json::insert((json *)local_740,(string *)local_760,(json *)&e_14);
  argo::json::~json((json *)&e_14);
  std::__cxx11::string::~string(local_760);
  std::allocator<char>::~allocator((allocator<char> *)&local_761);
  std::operator<<((ostream *)jlog,"FAIL: attempt insert into non-object failed to throw exception\n"
                 );
  argo::json::~json((json *)local_740);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_840,"123",(allocator *)&r2.field_0x57);
  argo::json::json((json *)local_820,number_int_e,(string *)local_840);
  std::__cxx11::string::~string(local_840);
  std::allocator<char>::~allocator((allocator<char> *)&r2.field_0x57);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_8c0,"123",(allocator *)((long)&e_15 + 7));
  argo::json::json((json *)local_8a0,number_int_e,(string *)local_8c0);
  std::__cxx11::string::~string(local_8c0);
  std::allocator<char>::~allocator((allocator<char> *)((long)&e_15 + 7));
  bVar1 = argo::json::operator==((json *)local_820,(json *)local_8a0);
  if (bVar1) {
    std::operator<<((ostream *)jlog,"PASS: attempt to compare raw ints failed to throw exception\n")
    ;
  }
  argo::json::~json((json *)local_8a0);
  argo::json::~json((json *)local_820);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_948,"123",(allocator *)((long)&e_16 + 7));
  argo::json::json((json *)local_928,number_int_e,(string *)local_948);
  std::__cxx11::string::~string(local_948);
  std::allocator<char>::~allocator((allocator<char> *)((long)&e_16 + 7));
  bVar1 = argo::json::operator==((json *)local_928,0x7b);
  if (bVar1) {
    std::operator<<((ostream *)jlog,
                    "FAIL: attempt to compare raw int to int failed to throw exception\n");
  }
  argo::json::~json((json *)local_928);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_9d0,"123",(allocator *)&r2_1.field_0x57);
  argo::json::json((json *)local_9b0,string_e,(string *)local_9d0);
  std::__cxx11::string::~string(local_9d0);
  std::allocator<char>::~allocator((allocator<char> *)&r2_1.field_0x57);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_a50,"123",(allocator *)((long)&e_17 + 7));
  argo::json::json((json *)local_a30,string_e,(string *)local_a50);
  std::__cxx11::string::~string(local_a50);
  std::allocator<char>::~allocator((allocator<char> *)((long)&e_17 + 7));
  bVar1 = argo::json::operator==((json *)local_9b0,(json *)local_a30);
  if (bVar1) {
    std::operator<<((ostream *)jlog,
                    "FAIL: attempt to compare raw strings failed to throw exception\n");
  }
  argo::json::~json((json *)local_a30);
  argo::json::~json((json *)local_9b0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_ad8,"123",(allocator *)((long)&e_18 + 7));
  argo::json::json((json *)local_ab8,string_e,(string *)local_ad8);
  std::__cxx11::string::~string(local_ad8);
  std::allocator<char>::~allocator((allocator<char> *)((long)&e_18 + 7));
  bVar1 = argo::json::operator==((json *)local_ab8,"123");
  if (bVar1) {
    std::operator<<((ostream *)jlog,
                    "FAIL: attempt to compare raw strings failed to throw exception\n");
  }
  argo::json::~json((json *)local_ab8);
  argo::json::json((json *)&j2.field_0x50,100);
  argo::json::json((json *)&e_19,"asdasd");
  argo::json::operator<((json *)&j2.field_0x50,(json *)&e_19);
  std::operator<<((ostream *)jlog,"FAIL: < compare incomparable types failed to throw exception\n");
  argo::json::~json((json *)&e_19);
  argo::json::~json((json *)&j2.field_0x50);
  argo::json::json((json *)&j2_1.field_0x50,100);
  argo::json::json((json *)&e_20,"asdasd");
  argo::json::operator<=((json *)&j2_1.field_0x50,(json *)&e_20);
  std::operator<<((ostream *)jlog,"FAIL: <= compare incomparable types failed to throw exception\n")
  ;
  argo::json::~json((json *)&e_20);
  argo::json::~json((json *)&j2_1.field_0x50);
  argo::json::json((json *)&j2_2.field_0x50,100);
  argo::json::json((json *)&e_21,"asdasd");
  argo::json::operator>((json *)&j2_2.field_0x50,(json *)&e_21);
  std::operator<<((ostream *)jlog,"FAIL: > compare incomparable types failed to throw exception\n");
  argo::json::~json((json *)&e_21);
  argo::json::~json((json *)&j2_2.field_0x50);
  argo::json::json((json *)&j2_3.field_0x50,100);
  argo::json::json((json *)&e_22,"asdasd");
  argo::json::operator<=((json *)&j2_3.field_0x50,(json *)&e_22);
  std::operator<<((ostream *)jlog,"FAIL: >= compare incomparable types failed to throw exception\n")
  ;
  argo::json::~json((json *)&e_22);
  argo::json::~json((json *)&j2_3.field_0x50);
  argo::json::~json((json *)&j_14.field_0x50);
  return;
}

Assistant:

void test_json_class_exceptions()
{
    try
    {
        json j(static_cast<json::type>(100));
        jlog << "FAIL: construct invalid type failed to throw exception\n";
    }
    catch (json_exception &e)
    {
        if (e.get_type() != json_exception::invalid_json_type_e)
        {
            jlog << "FAIL: construct invalid type threw wrong exception type\n";
            jlog << e.what() << endl;
        }
        else
        {
            jlog << "PASS: construct invalid type threw correct exception type\n";
        }
    }

    try
    {
        json j(json::array_e, "asdadasd");
        jlog << "FAIL: construct invalid type with raw value failed to throw exception\n";
    }
    catch (json_exception &e)
    {
        if (e.get_type() != json_exception::not_number_or_string_e)
        {
            jlog << "FAIL: construct invalid type with raw value threw wrong exception type\n";
            jlog << e.what() << endl;
        }
        else
        {
            jlog << "PASS: construct invalid type with raw value threw correct exception type\n";
        }
    }

    try
    {
        json j(json::number_int_e, "100");
        (void)static_cast<int>(j);
        jlog << "FAIL: cast raw to int failed to throw exception\n";
    }
    catch (json_exception &e)
    {
        if (e.get_type() != json_exception::cant_cast_raw_e)
        {
            jlog << "FAIL: cast raw to int threw wrong exception type\n";
            jlog << e.what() << endl;
        }
        else
        {
            jlog << "PASS: cast raw to int threw correct exception type\n";
        }
    }

    try
    {
        json j("100");
        (void)static_cast<int>(j);
        jlog << "FAIL: cast string to int failed to throw exception\n";
    }
    catch (json_exception &e)
    {
        if (e.get_type() != json_exception::not_number_e)
        {
            jlog << "FAIL: cast string to int threw wrong exception type\n";
            jlog << e.what() << endl;
        }
        else
        {
            jlog << "PASS: cast string to int threw correct exception type\n";
        }
    }

    try
    {
        json j(json::number_double_e, "100");
        (void)static_cast<double>(j);
        jlog << "FAIL: cast raw double to double failed to throw exception\n";
    }
    catch (json_exception &e)
    {
        if (e.get_type() != json_exception::cant_cast_raw_e)
        {
            jlog << "FAIL: cast raw double to double threw wrong exception type\n";
            jlog << e.what() << endl;
        }
        else
        {
            jlog << "PASS: cast raw double to double threw correct exception type\n";
        }
    }

    try
    {
        json j("100");
        (void)static_cast<double>(j);
        jlog << "FAIL: cast string to double failed to throw exception\n";
    }
    catch (json_exception &e)
    {
        if (e.get_type() != json_exception::not_number_e)
        {
            jlog << "FAIL: cast string to double threw wrong exception type\n";
            jlog << e.what() << endl;
        }
        else
        {
            jlog << "PASS: cast string to double threw correct exception type\n";
        }
    }

    try
    {
        json j(json::string_e, "100");
        (void)static_cast<string>(j);
        jlog << "FAIL: cast raw string to string failed to throw exception\n";
    }
    catch (json_exception &e)
    {
        if (e.get_type() != json_exception::cant_cast_raw_e)
        {
            jlog << "FAIL: cast raw string to string threw wrong exception type\n";
            jlog << e.what() << endl;
        }
        else
        {
            jlog << "PASS: cast raw string to string threw correct exception type\n";
        }
    }

    try
    {
        json j(100);
        (void)static_cast<string>(j);
        jlog << "FAIL: cast int to string failed to throw exception\n";
    }
    catch (json_exception &e)
    {
        if (e.get_type() != json_exception::not_string_e)
        {
            jlog << "FAIL: cast int to string threw wrong exception type\n";
            jlog << e.what() << endl;
        }
        else
        {
            jlog << "PASS: cast int to string threw correct exception type\n";
        }
    }

    try
    {
        json j("asdasd");
        (void)static_cast<bool>(j);
        jlog << "FAIL: cast string to bool failed to throw exception\n";
    }
    catch (json_exception &e)
    {
        if (e.get_type() != json_exception::not_number_int_or_boolean_e)
        {
            jlog << "FAIL: cast string to bool threw wrong exception type\n";
            jlog << e.what() << endl;
        }
        else
        {
            jlog << "PASS: cast string to bool threw correct exception type\n";
        }
    }

    try
    {
        json j("asdasd");
        (void)j["asdasd"];
        jlog << "FAIL: attempt to access string via [\"name\"] failed to throw exception\n";
    }
    catch (json_exception &e)
    {
        if (e.get_type() != json_exception::not_an_object_e)
        {
            jlog << "FAIL: access string via [\"name\"] threw wrong exception type\n";
            jlog << e.what() << endl;
        }
        else
        {
            jlog << "PASS: access string via [\"name\"] threw correct exception type\n";
        }
    }

    try
    {
        json j("asdasd");
        (void)j[1];
        jlog << "FAIL: attempt to access string via [1] failed to throw exception\n";
    }
    catch (json_exception &e)
    {
        if (e.get_type() != json_exception::not_an_array_e)
        {
            jlog << "FAIL: access string via [1] threw wrong exception type\n";
            jlog << e.what() << endl;
        }
        else
        {
            jlog << "PASS: access string via [1] threw correct exception type\n";
        }
    }

    try
    {
        json j(json::array_e);
        (void)j[1];
        jlog << "FAIL: attempt to access item 1 of zero length array failed to throw exception\n";
    }
    catch (json_array_index_range_exception &e)
    {
        if (e.get_type() != json_exception::array_index_range_e)
        {
            jlog << "FAIL: access empty array via [1] threw wrong exception type\n";
            jlog << e.what() << endl;
        }
        else
        {
            jlog << "PASS: access empty array via [1] threw correct exception type\n";
        }
    }

    try
    {
        json j(json::array_e);
        (void)j[-1];
        jlog << "FAIL: attempt to access item -1 of zero length array failed to throw exception\n";
    }
    catch (json_array_index_range_exception &e)
    {
        if (e.get_type() != json_exception::array_index_range_e)
        {
            jlog << "FAIL: access empty array via [-1] threw wrong exception type\n";
            jlog << e.what() << endl;
        }
        else
        {
            jlog << "PASS: access empty array via [-1] threw correct exception type\n";
        }
    }

    json j(json::object_e);
    test_const_exception(j);

    try
    {
        json j(1);
        j.append(json(1));
        jlog << "FAIL: attempt to append to non-array failed to throw exception\n";
    }
    catch (json_exception &e)
    {
        if (e.get_type() != json_exception::not_an_array_e)
        {
            jlog << "FAIL: append to non-array threw wrong exception type\n";
            jlog << e.what() << endl;
        }
        else
        {
            jlog << "PASS: append to non-array threw correct exception type\n";
        }
    }

    try
    {
        json j(1);
        j.insert("asdasd", json(1));
        jlog << "FAIL: attempt insert into non-object failed to throw exception\n";
    }
    catch (json_exception &e)
    {
        if (e.get_type() != json_exception::not_an_object_e)
        {
            jlog << "FAIL: insert into non-object threw wrong exception type\n";
            jlog << e.what() << endl;
        }
        else
        {
            jlog << "PASS: insert into non-object threw correct exception type\n";
        }
    }

    try
    {
        json r1(json::number_int_e, "123");
        json r2(json::number_int_e, "123");
        if (r1 == r2)
        {
            jlog << "PASS: attempt to compare raw ints failed to throw exception\n";
        }
    }
    catch (json_exception &e)
    {
        if (e.get_type() != json_exception::cant_compare_raw_e)
        {
            jlog << "FAIL: compare raw ints threw wrong exception type\n";
            jlog << e.what() << endl;
        }
        else
        {
            jlog << "PASS: compare raw ints threw correct exception type\n";
        }
    }

    try
    {
        json r1(json::number_int_e, "123");
        if (r1 == 123)
        {
            jlog << "FAIL: attempt to compare raw int to int failed to throw exception\n";
        }
    }
    catch (json_exception &e)
    {
        if (e.get_type() != json_exception::cant_cast_raw_e)
        {
            jlog << "FAIL: compare raw int with int threw wrong exception type\n";
            jlog << e.what() << endl;
        }
        else
        {
            jlog << "PASS: compare raw int with int threw correct exception type\n";
        }
    }

    try
    {
        json r1(json::string_e, "123");
        json r2(json::string_e, "123");
        if (r1 == r2)
        {
            jlog << "FAIL: attempt to compare raw strings failed to throw exception\n";
        }
    }
    catch (json_exception &e)
    {
        if (e.get_type() != json_exception::cant_compare_raw_e)
        {
            jlog << "FAIL: compare raw strings threw wrong exception type\n";
            jlog << e.what() << endl;
        }
        else
        {
            jlog << "PASS: compare raw strings threw correct exception type\n";
        }
    }

    try
    {
        json r1(json::string_e, "123");
        if (r1 == "123")
        {
            jlog << "FAIL: attempt to compare raw strings failed to throw exception\n";
        }
    }
    catch (json_exception &e)
    {
        if (e.get_type() != json_exception::cant_cast_raw_e)
        {
            jlog << "FAIL: compare raw strings threw wrong exception type\n";
            jlog << e.what() << endl;
        }
        else
        {
            jlog << "PASS: compare raw strings threw correct exception type\n";
        }
    }

    try
    {
        json j1(100);
        json j2("asdasd");
        if (j1 < j2) {};
        jlog << "FAIL: < compare incomparable types failed to throw exception\n";
    }
    catch (json_exception &e)
    {
        if (e.get_type() != json_exception::types_not_comparable_e)
        {
            jlog << "FAIL: < compare incomparable types threw wrong exception type\n";
            jlog << e.what() << endl;
        }
        else
        {
            jlog << "PASS: < compare incomparable types threw correct exception type\n";
        }
    }

    try
    {
        json j1(100);
        json j2("asdasd");
        if (j1 <= j2) {};
        jlog << "FAIL: <= compare incomparable types failed to throw exception\n";
    }
    catch (json_exception &e)
    {
        if (e.get_type() != json_exception::types_not_comparable_e)
        {
            jlog << "FAIL: <= compare incomparable types threw wrong exception type\n";
            jlog << e.what() << endl;
        }
        else
        {
            jlog << "PASS: <= compare incomparable types threw correct exception type\n";
        }
    }

    try
    {
        json j1(100);
        json j2("asdasd");
        if (j1 > j2) {};
        jlog << "FAIL: > compare incomparable types failed to throw exception\n";
    }
    catch (json_exception &e)
    {
        if (e.get_type() != json_exception::types_not_comparable_e)
        {
            jlog << "FAIL: > compare incomparable types threw wrong exception type\n";
            jlog << e.what() << endl;
        }
        else
        {
            jlog << "PASS: > compare incomparable types threw correct exception type\n";
        }
    }

    try
    {
        json j1(100);
        json j2("asdasd");
        if (j1 <= j2) {};
        jlog << "FAIL: >= compare incomparable types failed to throw exception\n";
    }
    catch (json_exception &e)
    {
        if (e.get_type() != json_exception::types_not_comparable_e)
        {
            jlog << "FAIL: >= compare incomparable types threw wrong exception type\n";
            jlog << e.what() << endl;
        }
        else
        {
            jlog << "PASS: >= compare incomparable types threw correct exception type\n";
        }
    }
}